

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtransaction.cpp
# Opt level: O0

void __thiscall
ConfidentialTransaction_SetAssetReissuanceListTest_multi_Test::TestBody
          (ConfidentialTransaction_SetAssetReissuanceListTest_multi_Test *this)

{
  pointer *this_00;
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  Amount AVar4;
  AssertHelper local_8f0;
  Message local_8e8 [2];
  CfdException *anon_var_0_2;
  byte local_861;
  char *pcStack_860;
  bool gtest_caught_expected_2;
  ConstCharPtr gtest_msg_2;
  AssertHelper local_818;
  Message local_810 [2];
  CfdException *anon_var_0_1;
  byte local_789;
  char *pcStack_788;
  bool gtest_caught_expected_1;
  ConstCharPtr gtest_msg_1;
  Message local_778 [2];
  CfdException *anon_var_0;
  byte local_6f1;
  char *pcStack_6f0;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  AssertHelper local_6a8;
  Message local_6a0;
  string local_698;
  string local_678;
  undefined1 local_658 [8];
  AssertionResult gtest_ar_1;
  Message local_640;
  IssuanceParameter local_638;
  allocator local_5c1;
  string local_5c0;
  undefined1 local_5a0 [8];
  ConfidentialNonce nonce2;
  string local_570;
  undefined1 local_550 [8];
  ConfidentialNonce nonce1;
  string local_520;
  undefined1 local_500 [8];
  Script script2;
  string local_4c0;
  undefined1 local_4a0 [8];
  Script script1;
  undefined1 local_458 [8];
  Amount amount2;
  undefined1 local_438 [8];
  Amount amount1;
  AssertHelper local_3e8;
  Message local_3e0;
  string local_3d8;
  string local_3b8;
  undefined1 local_398 [8];
  AssertionResult gtest_ar;
  Message local_380 [2];
  IssuanceParameter local_370;
  undefined1 local_300 [8];
  IssuanceParameter param;
  string local_288;
  undefined1 local_268 [8];
  BlindFactor entropy;
  string local_240;
  undefined1 local_220 [8];
  BlindFactor blind_factor;
  undefined1 local_1f0 [8];
  Amount amount;
  ConfidentialTransaction tx;
  vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_> nonce_list;
  vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> script_list;
  vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> amount_list;
  string local_150;
  undefined1 local_130 [8];
  ConfidentialTransaction expect_tx2;
  string local_e8;
  undefined1 local_c8 [8];
  ConfidentialTransaction expect_tx1;
  allocator local_71;
  string local_70;
  undefined1 local_50 [8];
  ConfidentialTransaction tx_base;
  ConfidentialTransaction_SetAssetReissuanceListTest_multi_Test *this_local;
  
  tx_base.vout_.
  super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_70,
             "0200000000025e67a3542db02871642bdf0923d33ac5bd1105f3421520297f01617c6323918d0000000000ffffffff5e67a3542db02871642bdf0923d33ac5bd1105f3421520297f01617c6323918d0200000000ffffffff03017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18010000000029b9270003f4f10478f5fae2c77c44fdb2a304109a9ae8ba7cab1c125deba9e618ca737e851976a91484c2ef274919355bb532a5bbdbfa95490c5d749388ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b97049c03b69e5ef61aef08565404bc3c98d6e4dfd1e02eb94138617d9b3eb12ec790885317a91401e940d9dcd77a5043356941641aa2fd6ec6a68887017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18010000000000002710000000000000"
             ,&local_71);
  cfd::core::ConfidentialTransaction::ConfidentialTransaction
            ((ConfidentialTransaction *)local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_e8,
             "0200000000025e67a3542db02871642bdf0923d33ac5bd1105f3421520297f01617c6323918d0000000000ffffffff5e67a3542db02871642bdf0923d33ac5bd1105f3421520297f01617c6323918d0200008000ffffffffcf9a1b9aeb2de6a7b7c3177433dced0951fd728dffbe8c935ccb80698f2e08c80683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000029b927000003017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18010000000029b9270003f4f10478f5fae2c77c44fdb2a304109a9ae8ba7cab1c125deba9e618ca737e851976a91484c2ef274919355bb532a5bbdbfa95490c5d749388ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b97049c03b69e5ef61aef08565404bc3c98d6e4dfd1e02eb94138617d9b3eb12ec790885317a91401e940d9dcd77a5043356941641aa2fd6ec6a68887017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18010000000000002710000000000000"
             ,(allocator *)
              ((long)&expect_tx2.vout_.
                      super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::ConfidentialTransaction::ConfidentialTransaction
            ((ConfidentialTransaction *)local_c8,&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&expect_tx2.vout_.
                     super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_150,
             "0200000000025e67a3542db02871642bdf0923d33ac5bd1105f3421520297f01617c6323918d0000000000ffffffff5e67a3542db02871642bdf0923d33ac5bd1105f3421520297f01617c6323918d0200008000ffffffffcf9a1b9aeb2de6a7b7c3177433dced0951fd728dffbe8c935ccb80698f2e08c80683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000029b927000005017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18010000000029b9270003f4f10478f5fae2c77c44fdb2a304109a9ae8ba7cab1c125deba9e618ca737e851976a91484c2ef274919355bb532a5bbdbfa95490c5d749388ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b97049c03b69e5ef61aef08565404bc3c98d6e4dfd1e02eb94138617d9b3eb12ec790885317a91401e940d9dcd77a5043356941641aa2fd6ec6a68887017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18010000000000002710000001cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000011e1a30003f234757d0e00e6a7a7a3b4b2b31fb0328d7b9f755cd1093d9f61892fef3116871976a91435ef6d4b59f26089dfe2abca21408e15fee42a3388ac01cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000017d7840002074a50df2248e62bbd18a4a4abf2c8923f0740da61a28dc9e9156092c90e20aa16001435ef6d4b59f26089dfe2abca21408e15fee42a3300000000"
             ,(allocator *)
              ((long)&amount_list.
                      super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::ConfidentialTransaction::ConfidentialTransaction
            ((ConfidentialTransaction *)local_130,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&amount_list.
                     super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::vector
            ((vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)
             &script_list.super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::vector
            ((vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *)
             &nonce_list.
              super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>::vector
            ((vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_> *)
             &tx.vout_.
              super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ConfidentialTransaction::ConfidentialTransaction
            ((ConfidentialTransaction *)&amount.ignore_check_,(ConfidentialTransaction *)local_50);
  AVar4 = cfd::core::Amount::CreateByCoinAmount(7.0);
  blind_factor.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)AVar4.amount_;
  amount.amount_._0_1_ = AVar4.ignore_check_;
  local_1f0 = (undefined1  [8])
              blind_factor.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_240,"c8082e8f6980cb5c938cbeff8d72fd5109eddc337417c3b7a7e62deb9a1b9acf"
             ,(allocator *)
              ((long)&entropy.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::BlindFactor::BlindFactor((BlindFactor *)local_220,&local_240);
  std::__cxx11::string::~string((string *)&local_240);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&entropy.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_288,"6f9ccf5949eba5d6a08bff7a015e825c97824e82d57c8a0c77f9a41908fe8306"
             ,(allocator *)&param.token.field_0x27);
  cfd::core::BlindFactor::BlindFactor((BlindFactor *)local_268,&local_288);
  std::__cxx11::string::~string((string *)&local_288);
  std::allocator<char>::~allocator((allocator<char> *)&param.token.field_0x27);
  cfd::core::IssuanceParameter::IssuanceParameter((IssuanceParameter *)local_300);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ConfidentialTransaction::SetAssetReissuance
                (&local_370,(ConfidentialTransaction *)&amount.ignore_check_,1,(Amount *)local_1f0,
                 (vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)
                 &script_list.
                  super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *)
                 &nonce_list.
                  super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
                  *)&tx.vout_.
                     super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,(BlindFactor *)local_220,
                 (BlindFactor *)local_268);
      cfd::core::IssuanceParameter::operator=((IssuanceParameter *)local_300,&local_370);
      cfd::core::IssuanceParameter::~IssuanceParameter(&local_370);
    }
  }
  else {
    testing::Message::Message(local_380);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x583,
               "Expected: (param = tx.SetAssetReissuance(1, amount, amount_list, script_list, nonce_list, blind_factor, entropy)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,local_380);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    testing::Message::~Message(local_380);
  }
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_
            (&local_3b8,(AbstractTransaction *)&amount.ignore_check_);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_(&local_3d8,(AbstractTransaction *)local_c8);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_398,"tx.GetHex().c_str()","expect_tx1.GetHex().c_str()",pcVar2,pcVar3
            );
  std::__cxx11::string::~string((string *)&local_3d8);
  std::__cxx11::string::~string((string *)&local_3b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_398);
  if (!bVar1) {
    testing::Message::Message(&local_3e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_398);
    testing::internal::AssertHelper::AssertHelper
              (&local_3e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x584,pcVar2);
    testing::internal::AssertHelper::operator=(&local_3e8,&local_3e0);
    testing::internal::AssertHelper::~AssertHelper(&local_3e8);
    testing::Message::~Message(&local_3e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_398);
  cfd::core::ConfidentialTransaction::ConfidentialTransaction
            ((ConfidentialTransaction *)&amount1.ignore_check_,(ConfidentialTransaction *)local_50);
  cfd::core::ConfidentialTransaction::operator=
            ((ConfidentialTransaction *)&amount.ignore_check_,
             (ConfidentialTransaction *)&amount1.ignore_check_);
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction
            ((ConfidentialTransaction *)&amount1.ignore_check_);
  AVar4 = cfd::core::Amount::CreateByCoinAmount(3.0);
  amount2._8_8_ = AVar4.amount_;
  amount1.amount_._0_1_ = AVar4.ignore_check_;
  local_438 = (undefined1  [8])amount2._8_8_;
  AVar4 = cfd::core::Amount::CreateByCoinAmount(4.0);
  script1.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)AVar4.amount_;
  amount2.amount_._0_1_ = AVar4.ignore_check_;
  local_458 = (undefined1  [8])
              script1.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_4c0,"76a91435ef6d4b59f26089dfe2abca21408e15fee42a3388ac",
             (allocator *)
             ((long)&script2.script_stack_.
                     super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::Script::Script((Script *)local_4a0,&local_4c0);
  std::__cxx11::string::~string((string *)&local_4c0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&script2.script_stack_.
                     super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_520,"001435ef6d4b59f26089dfe2abca21408e15fee42a33",
             (allocator *)&nonce1.field_0x27);
  cfd::core::Script::Script((Script *)local_500,&local_520);
  std::__cxx11::string::~string((string *)&local_520);
  std::allocator<char>::~allocator((allocator<char> *)&nonce1.field_0x27);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_570,
             "03f234757d0e00e6a7a7a3b4b2b31fb0328d7b9f755cd1093d9f61892fef311687",
             (allocator *)&nonce2.field_0x27);
  cfd::core::ConfidentialNonce::ConfidentialNonce((ConfidentialNonce *)local_550,&local_570);
  std::__cxx11::string::~string((string *)&local_570);
  std::allocator<char>::~allocator((allocator<char> *)&nonce2.field_0x27);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_5c0,
             "02074a50df2248e62bbd18a4a4abf2c8923f0740da61a28dc9e9156092c90e20aa",&local_5c1);
  cfd::core::ConfidentialNonce::ConfidentialNonce((ConfidentialNonce *)local_5a0,&local_5c0);
  std::__cxx11::string::~string((string *)&local_5c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5c1);
  std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::push_back
            ((vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)
             &script_list.super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_438);
  std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::push_back
            ((vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *)
             &nonce_list.
              super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_4a0);
  std::vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>::
  push_back((vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_> *)
            &tx.vout_.
             super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_550);
  std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::push_back
            ((vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)
             &script_list.super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_458);
  std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::push_back
            ((vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *)
             &nonce_list.
              super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_500);
  std::vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>::
  push_back((vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_> *)
            &tx.vout_.
             super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_5a0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ConfidentialTransaction::SetAssetReissuance
                (&local_638,(ConfidentialTransaction *)&amount.ignore_check_,1,(Amount *)local_1f0,
                 (vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)
                 &script_list.
                  super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *)
                 &nonce_list.
                  super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
                  *)&tx.vout_.
                     super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,(BlindFactor *)local_220,
                 (BlindFactor *)local_268);
      cfd::core::IssuanceParameter::operator=((IssuanceParameter *)local_300,&local_638);
      cfd::core::IssuanceParameter::~IssuanceParameter(&local_638);
    }
  }
  else {
    testing::Message::Message(&local_640);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x596,
               "Expected: (param = tx.SetAssetReissuance(1, amount, amount_list, script_list, nonce_list, blind_factor, entropy)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_640);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_640);
  }
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_
            (&local_678,(AbstractTransaction *)&amount.ignore_check_);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_(&local_698,(AbstractTransaction *)local_130);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_658,"tx.GetHex().c_str()","expect_tx2.GetHex().c_str()",pcVar2,pcVar3
            );
  std::__cxx11::string::~string((string *)&local_698);
  std::__cxx11::string::~string((string *)&local_678);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_658);
  if (!bVar1) {
    testing::Message::Message(&local_6a0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_658);
    testing::internal::AssertHelper::AssertHelper
              (&local_6a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x597,pcVar2);
    testing::internal::AssertHelper::operator=(&local_6a8,&local_6a0);
    testing::internal::AssertHelper::~AssertHelper(&local_6a8);
    testing::Message::~Message(&local_6a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_658);
  cfd::core::ConfidentialTransaction::ConfidentialTransaction
            ((ConfidentialTransaction *)&gtest_msg,(ConfidentialTransaction *)local_50);
  cfd::core::ConfidentialTransaction::operator=
            ((ConfidentialTransaction *)&amount.ignore_check_,(ConfidentialTransaction *)&gtest_msg)
  ;
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction
            ((ConfidentialTransaction *)&gtest_msg);
  this_00 = &script_list.super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage;
  std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::clear
            ((vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)this_00);
  std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::clear
            ((vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *)
             &nonce_list.
              super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>::clear
            ((vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_> *)
             &tx.vout_.
              super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::push_back
            ((vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)this_00,
             (value_type *)local_1f0);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffff910,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffff910);
  if (bVar1) {
    local_6f1 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ConfidentialTransaction::SetAssetReissuance
                ((IssuanceParameter *)&anon_var_0,(ConfidentialTransaction *)&amount.ignore_check_,1
                 ,(Amount *)local_1f0,
                 (vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)
                 &script_list.
                  super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *)
                 &nonce_list.
                  super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
                  *)&tx.vout_.
                     super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,(BlindFactor *)local_220,
                 (BlindFactor *)local_268);
      cfd::core::IssuanceParameter::operator=
                ((IssuanceParameter *)local_300,(IssuanceParameter *)&anon_var_0);
      cfd::core::IssuanceParameter::~IssuanceParameter((IssuanceParameter *)&anon_var_0);
    }
    if ((local_6f1 & 1) == 0) {
      pcStack_6f0 = 
      "Expected: param = tx.SetAssetReissuance(1, amount, amount_list, script_list, nonce_list, blind_factor, entropy) throws an exception of type CfdException.\n  Actual: it throws nothing."
      ;
      goto LAB_0046e914;
    }
  }
  else {
LAB_0046e914:
    testing::Message::Message(local_778);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_msg_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x5a1,pcStack_6f0);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_msg_1,local_778);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_msg_1);
    testing::Message::~Message(local_778);
  }
  std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::clear
            ((vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)
             &script_list.super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::push_back
            ((vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *)
             &nonce_list.
              super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_4a0);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffff878,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffff878);
  if (bVar1) {
    local_789 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ConfidentialTransaction::SetAssetReissuance
                ((IssuanceParameter *)&anon_var_0_1,(ConfidentialTransaction *)local_50,1,
                 (Amount *)local_1f0,
                 (vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)
                 &script_list.
                  super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *)
                 &nonce_list.
                  super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
                  *)&tx.vout_.
                     super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,(BlindFactor *)local_220,
                 (BlindFactor *)local_268);
      cfd::core::IssuanceParameter::operator=
                ((IssuanceParameter *)local_300,(IssuanceParameter *)&anon_var_0_1);
      cfd::core::IssuanceParameter::~IssuanceParameter((IssuanceParameter *)&anon_var_0_1);
    }
    if ((local_789 & 1) == 0) {
      pcStack_788 = 
      "Expected: param = tx_base.SetAssetReissuance(1, amount, amount_list, script_list, nonce_list, blind_factor, entropy) throws an exception of type CfdException.\n  Actual: it throws nothing."
      ;
      goto LAB_0046eb3d;
    }
  }
  else {
LAB_0046eb3d:
    testing::Message::Message(local_810);
    testing::internal::AssertHelper::AssertHelper
              (&local_818,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
               ,0x5a5,pcStack_788);
    testing::internal::AssertHelper::operator=(&local_818,local_810);
    testing::internal::AssertHelper::~AssertHelper(&local_818);
    testing::Message::~Message(local_810);
  }
  std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::clear
            ((vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *)
             &nonce_list.
              super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ConfidentialTransaction::ConfidentialTransaction
            ((ConfidentialTransaction *)&gtest_msg_2,(ConfidentialTransaction *)local_50);
  cfd::core::ConfidentialTransaction::operator=
            ((ConfidentialTransaction *)&amount.ignore_check_,
             (ConfidentialTransaction *)&gtest_msg_2);
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction
            ((ConfidentialTransaction *)&gtest_msg_2);
  std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::push_back
            ((vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)
             &script_list.super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_438);
  std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::push_back
            ((vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *)
             &nonce_list.
              super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_4a0);
  std::vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>::
  push_back((vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_> *)
            &tx.vout_.
             super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,(value_type *)local_550);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xfffffffffffff7a0,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xfffffffffffff7a0);
  if (bVar1) {
    local_861 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ConfidentialTransaction::SetAssetReissuance
                ((IssuanceParameter *)&anon_var_0_2,(ConfidentialTransaction *)&amount.ignore_check_
                 ,1,(Amount *)local_1f0,
                 (vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)
                 &script_list.
                  super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,
                 (vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *)
                 &nonce_list.
                  super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
                  *)&tx.vout_.
                     super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage,(BlindFactor *)local_220,
                 (BlindFactor *)local_268);
      cfd::core::IssuanceParameter::operator=
                ((IssuanceParameter *)local_300,(IssuanceParameter *)&anon_var_0_2);
      cfd::core::IssuanceParameter::~IssuanceParameter((IssuanceParameter *)&anon_var_0_2);
    }
    if ((local_861 & 1) != 0) goto LAB_0046ee7d;
    pcStack_860 = 
    "Expected: param = tx.SetAssetReissuance(1, amount, amount_list, script_list, nonce_list, blind_factor, entropy) throws an exception of type CfdException.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_8e8);
  testing::internal::AssertHelper::AssertHelper
            (&local_8f0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/test/test_elements_confidentialtransaction.cpp"
             ,0x5af,pcStack_860);
  testing::internal::AssertHelper::operator=(&local_8f0,local_8e8);
  testing::internal::AssertHelper::~AssertHelper(&local_8f0);
  testing::Message::~Message(local_8e8);
LAB_0046ee7d:
  std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::clear
            ((vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)
             &script_list.super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ConfidentialNonce::~ConfidentialNonce((ConfidentialNonce *)local_5a0);
  cfd::core::ConfidentialNonce::~ConfidentialNonce((ConfidentialNonce *)local_550);
  cfd::core::Script::~Script((Script *)local_500);
  cfd::core::Script::~Script((Script *)local_4a0);
  cfd::core::IssuanceParameter::~IssuanceParameter((IssuanceParameter *)local_300);
  cfd::core::BlindFactor::~BlindFactor((BlindFactor *)local_268);
  cfd::core::BlindFactor::~BlindFactor((BlindFactor *)local_220);
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction
            ((ConfidentialTransaction *)&amount.ignore_check_);
  std::vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>::~vector
            ((vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_> *)
             &tx.vout_.
              super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::~vector
            ((vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> *)
             &nonce_list.
              super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>::~vector
            ((vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> *)
             &script_list.super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction((ConfidentialTransaction *)local_130)
  ;
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction((ConfidentialTransaction *)local_c8);
  cfd::core::ConfidentialTransaction::~ConfidentialTransaction((ConfidentialTransaction *)local_50);
  return;
}

Assistant:

TEST(ConfidentialTransaction, SetAssetReissuanceListTest_multi) {
  ConfidentialTransaction tx_base(
      "0200000000025e67a3542db02871642bdf0923d33ac5bd1105f3421520297f01617c6323918d0000000000ffffffff5e67a3542db02871642bdf0923d33ac5bd1105f3421520297f01617c6323918d0200000000ffffffff03017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18010000000029b9270003f4f10478f5fae2c77c44fdb2a304109a9ae8ba7cab1c125deba9e618ca737e851976a91484c2ef274919355bb532a5bbdbfa95490c5d749388ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b97049c03b69e5ef61aef08565404bc3c98d6e4dfd1e02eb94138617d9b3eb12ec790885317a91401e940d9dcd77a5043356941641aa2fd6ec6a68887017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18010000000000002710000000000000");
  ConfidentialTransaction expect_tx1(
      "0200000000025e67a3542db02871642bdf0923d33ac5bd1105f3421520297f01617c6323918d0000000000ffffffff5e67a3542db02871642bdf0923d33ac5bd1105f3421520297f01617c6323918d0200008000ffffffffcf9a1b9aeb2de6a7b7c3177433dced0951fd728dffbe8c935ccb80698f2e08c80683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000029b927000003017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18010000000029b9270003f4f10478f5fae2c77c44fdb2a304109a9ae8ba7cab1c125deba9e618ca737e851976a91484c2ef274919355bb532a5bbdbfa95490c5d749388ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b97049c03b69e5ef61aef08565404bc3c98d6e4dfd1e02eb94138617d9b3eb12ec790885317a91401e940d9dcd77a5043356941641aa2fd6ec6a68887017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18010000000000002710000000000000");
  ConfidentialTransaction expect_tx2(
      "0200000000025e67a3542db02871642bdf0923d33ac5bd1105f3421520297f01617c6323918d0000000000ffffffff5e67a3542db02871642bdf0923d33ac5bd1105f3421520297f01617c6323918d0200008000ffffffffcf9a1b9aeb2de6a7b7c3177433dced0951fd728dffbe8c935ccb80698f2e08c80683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000029b927000005017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18010000000029b9270003f4f10478f5fae2c77c44fdb2a304109a9ae8ba7cab1c125deba9e618ca737e851976a91484c2ef274919355bb532a5bbdbfa95490c5d749388ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b97049c03b69e5ef61aef08565404bc3c98d6e4dfd1e02eb94138617d9b3eb12ec790885317a91401e940d9dcd77a5043356941641aa2fd6ec6a68887017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18010000000000002710000001cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000011e1a30003f234757d0e00e6a7a7a3b4b2b31fb0328d7b9f755cd1093d9f61892fef3116871976a91435ef6d4b59f26089dfe2abca21408e15fee42a3388ac01cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000017d7840002074a50df2248e62bbd18a4a4abf2c8923f0740da61a28dc9e9156092c90e20aa16001435ef6d4b59f26089dfe2abca21408e15fee42a3300000000");

  std::vector<Amount> amount_list;
  std::vector<Script> script_list;
  std::vector<ConfidentialNonce> nonce_list;

  // empty check
  ConfidentialTransaction tx(tx_base);
  Amount amount = Amount::CreateByCoinAmount(7.0);
  BlindFactor blind_factor("c8082e8f6980cb5c938cbeff8d72fd5109eddc337417c3b7a7e62deb9a1b9acf");
  BlindFactor entropy("6f9ccf5949eba5d6a08bff7a015e825c97824e82d57c8a0c77f9a41908fe8306");
  IssuanceParameter param;
  EXPECT_NO_THROW(
      (param = tx.SetAssetReissuance(1, amount, amount_list, script_list,
          nonce_list, blind_factor, entropy)));
  EXPECT_STREQ(tx.GetHex().c_str(), expect_tx1.GetHex().c_str());

  // 2-output check
  tx = ConfidentialTransaction(tx_base);
  Amount amount1 = Amount::CreateByCoinAmount(3.0);
  Amount amount2 = Amount::CreateByCoinAmount(4.0);
  Script script1("76a91435ef6d4b59f26089dfe2abca21408e15fee42a3388ac");
  Script script2("001435ef6d4b59f26089dfe2abca21408e15fee42a33");
  ConfidentialNonce nonce1("03f234757d0e00e6a7a7a3b4b2b31fb0328d7b9f755cd1093d9f61892fef311687");
  ConfidentialNonce nonce2("02074a50df2248e62bbd18a4a4abf2c8923f0740da61a28dc9e9156092c90e20aa");
  amount_list.push_back(amount1);
  script_list.push_back(script1);
  nonce_list.push_back(nonce1);
  amount_list.push_back(amount2);
  script_list.push_back(script2);
  nonce_list.push_back(nonce2);
  EXPECT_NO_THROW(
      (param = tx.SetAssetReissuance(1, amount, amount_list, script_list,
          nonce_list, blind_factor, entropy)));
  EXPECT_STREQ(tx.GetHex().c_str(), expect_tx2.GetHex().c_str());

  // error (count unmatch)
  {
    tx = ConfidentialTransaction(tx_base);
    amount_list.clear();
    script_list.clear();
    nonce_list.clear();
    amount_list.push_back(amount);
    EXPECT_THROW(param = tx.SetAssetReissuance(1, amount, amount_list, script_list,
          nonce_list, blind_factor, entropy), CfdException);
    amount_list.clear();
    script_list.push_back(script1);
    EXPECT_THROW(param = tx_base.SetAssetReissuance(1, amount, amount_list, script_list,
          nonce_list, blind_factor, entropy), CfdException);
    script_list.clear();
  }
  // error (amount unmatch)
  {
    tx = ConfidentialTransaction(tx_base);
    amount_list.push_back(amount1);
    script_list.push_back(script1);
    nonce_list.push_back(nonce1);
    EXPECT_THROW(param = tx.SetAssetReissuance(1, amount, amount_list, script_list,
          nonce_list, blind_factor, entropy), CfdException);
    amount_list.clear();
  }
}